

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormat::setExponentSignAlwaysShown(DecimalFormat *this,UBool expSignAlways)

{
  DecimalFormatProperties *pDVar1;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (pDVar1->exponentSignAlwaysShown == (bool)expSignAlways) {
    return;
  }
  pDVar1->exponentSignAlwaysShown = expSignAlways != '\0';
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setExponentSignAlwaysShown(UBool expSignAlways) {
    if (UBOOL_TO_BOOL(expSignAlways) == fields->properties->exponentSignAlwaysShown) { return; }
    fields->properties->exponentSignAlwaysShown = expSignAlways;
    touchNoError();
}